

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O3

TextureMapping2DHandle __thiscall
pbrt::TextureMapping2DHandle::Create
          (TextureMapping2DHandle *this,ParameterDictionary *parameters,Transform *renderFromTexture
          ,FileLoc *loc,Allocator alloc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  uintptr_t iptr;
  Float *pFVar5;
  undefined4 extraout_var_00;
  ulong uVar6;
  undefined8 *puVar7;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  Float FVar8;
  Float FVar9;
  undefined8 uVar10;
  Vector3f VVar11;
  Vector3f VVar12;
  string ret;
  string type;
  string local_180;
  Float local_160;
  Float local_15c;
  string local_158;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  string local_d8;
  Float local_b8;
  float fStack_b4;
  undefined8 uStack_b0;
  Float local_a8;
  float fStack_a4;
  undefined8 uStack_a0;
  string local_90;
  string local_70;
  Tuple3<pbrt::Vector3,_float> local_50;
  Tuple3<pbrt::Vector3,_float> local_40;
  undefined4 extraout_var;
  undefined4 extraout_var_01;
  
  paVar1 = &local_158.field_2;
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"mapping","");
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"uv","");
  ParameterDictionary::GetOneString(&local_d8,parameters,&local_158,&local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  iVar4 = std::__cxx11::string::compare((char *)&local_d8);
  if (iVar4 == 0) {
    local_158._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"uscale","");
    local_a8 = ParameterDictionary::GetOneFloat(parameters,&local_158,1.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar1) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    local_158._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"vscale","");
    FVar8 = ParameterDictionary::GetOneFloat(parameters,&local_158,1.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar1) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    local_158._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"udelta","");
    local_b8 = ParameterDictionary::GetOneFloat(parameters,&local_158,0.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar1) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    local_158._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"vdelta","");
    FVar9 = ParameterDictionary::GetOneFloat(parameters,&local_158,0.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar1) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    iVar4 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x10,4);
    pFVar5 = (Float *)CONCAT44(extraout_var_00,iVar4);
    *pFVar5 = local_a8;
    pFVar5[1] = FVar8;
    pFVar5[2] = local_b8;
    pFVar5[3] = FVar9;
LAB_002aa933:
    uVar6 = (ulong)pFVar5 | 0x1000000000000;
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)&local_d8);
    if (iVar4 != 0) {
      iVar4 = std::__cxx11::string::compare((char *)&local_d8);
      if (iVar4 == 0) {
        local_158._M_dataplus._M_p = *(pointer *)(renderFromTexture->mInv).m[0];
        local_158._M_string_length = *(size_type *)((renderFromTexture->mInv).m[0] + 2);
        local_158.field_2._M_allocated_capacity = *(undefined8 *)(renderFromTexture->mInv).m[1];
        local_158.field_2._8_8_ = *(undefined8 *)((renderFromTexture->mInv).m[1] + 2);
        uStack_138 = *(undefined8 *)(renderFromTexture->mInv).m[2];
        uStack_130 = *(undefined8 *)((renderFromTexture->mInv).m[2] + 2);
        uStack_128 = *(undefined8 *)(renderFromTexture->mInv).m[3];
        uStack_120 = *(undefined8 *)((renderFromTexture->mInv).m[3] + 2);
        local_118 = *(undefined8 *)(renderFromTexture->m).m[0];
        uStack_110 = *(undefined8 *)((renderFromTexture->m).m[0] + 2);
        uStack_108 = *(undefined8 *)(renderFromTexture->m).m[1];
        uStack_100 = *(undefined8 *)((renderFromTexture->m).m[1] + 2);
        uStack_f8 = *(undefined8 *)(renderFromTexture->m).m[2];
        uStack_f0 = *(undefined8 *)((renderFromTexture->m).m[2] + 2);
        uStack_e8 = *(undefined8 *)(renderFromTexture->m).m[3];
        uStack_e0 = *(undefined8 *)((renderFromTexture->m).m[3] + 2);
        iVar4 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x80,4);
        puVar7 = (undefined8 *)CONCAT44(extraout_var_02,iVar4);
        puVar7[8] = local_118;
        puVar7[9] = uStack_110;
        puVar7[10] = uStack_108;
        puVar7[0xb] = uStack_100;
        puVar7[0xc] = uStack_f8;
        puVar7[0xd] = uStack_f0;
        puVar7[0xe] = uStack_e8;
        puVar7[0xf] = uStack_e0;
        *puVar7 = local_158._M_dataplus._M_p;
        puVar7[1] = local_158._M_string_length;
        puVar7[2] = local_158.field_2._M_allocated_capacity;
        puVar7[3] = local_158.field_2._8_8_;
        puVar7[4] = uStack_138;
        puVar7[5] = uStack_130;
        puVar7[6] = uStack_128;
        puVar7[7] = uStack_120;
        (this->
        super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
        ).bits = (ulong)puVar7 | 0x3000000000000;
        goto LAB_002aa99f;
      }
      iVar4 = std::__cxx11::string::compare((char *)&local_d8);
      if (iVar4 == 0) {
        local_158._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"v1","");
        uVar10 = 0;
        local_40._0_8_ = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
        local_40.z = 0.0;
        VVar11 = ParameterDictionary::GetOneVector3f(parameters,&local_158,(Vector3f *)&local_40);
        local_a8 = VVar11.super_Tuple3<pbrt::Vector3,_float>.x;
        fStack_a4 = VVar11.super_Tuple3<pbrt::Vector3,_float>.y;
        local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
        uStack_a0 = uVar10;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"v2","");
        uVar10 = 0;
        local_50.x = 0.0;
        local_50.y = 1.0;
        local_50.z = 0.0;
        VVar12 = ParameterDictionary::GetOneVector3f(parameters,&local_180,(Vector3f *)&local_50);
        local_b8 = VVar12.super_Tuple3<pbrt::Vector3,_float>.x;
        fStack_b4 = VVar12.super_Tuple3<pbrt::Vector3,_float>.y;
        uStack_b0 = uVar10;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"udelta","");
        local_15c = ParameterDictionary::GetOneFloat(parameters,&local_70,0.0);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"vdelta","");
        local_160 = ParameterDictionary::GetOneFloat(parameters,&local_90,0.0);
        iVar4 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x20,4);
        puVar7 = (undefined8 *)CONCAT44(extraout_var_03,iVar4);
        auVar3._4_4_ = fStack_a4;
        auVar3._0_4_ = local_a8;
        auVar3._8_8_ = uStack_a0;
        auVar2._4_4_ = fStack_b4;
        auVar2._0_4_ = local_b8;
        auVar2._8_8_ = uStack_b0;
        uVar10 = vmovlps_avx(auVar3);
        *puVar7 = uVar10;
        *(float *)(puVar7 + 1) = VVar11.super_Tuple3<pbrt::Vector3,_float>.z;
        uVar10 = vmovlps_avx(auVar2);
        *(undefined8 *)((long)puVar7 + 0xc) = uVar10;
        *(float *)((long)puVar7 + 0x14) = VVar12.super_Tuple3<pbrt::Vector3,_float>.z;
        *(Float *)(puVar7 + 3) = local_15c;
        *(Float *)((long)puVar7 + 0x1c) = local_160;
        (this->
        super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
        ).bits = (ulong)puVar7 | 0x4000000000000;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != &local_180.field_2) {
          operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != paVar1) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        goto LAB_002aa99f;
      }
      local_158._M_string_length = 0;
      local_158.field_2._M_allocated_capacity =
           local_158.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_158._M_dataplus._M_p = (pointer)paVar1;
      detail::stringPrintfRecursive<std::__cxx11::string&>
                (&local_158,"2D texture mapping \"%s\" unknown",&local_d8);
      Error(loc,local_158._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != paVar1) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      iVar4 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x10,4);
      pFVar5 = (Float *)CONCAT44(extraout_var,iVar4);
      pFVar5[0] = 1.0;
      pFVar5[1] = 1.0;
      pFVar5[2] = 0.0;
      pFVar5[3] = 0.0;
      goto LAB_002aa933;
    }
    local_158._M_dataplus._M_p = *(pointer *)(renderFromTexture->mInv).m[0];
    local_158._M_string_length = *(size_type *)((renderFromTexture->mInv).m[0] + 2);
    local_158.field_2._M_allocated_capacity = *(undefined8 *)(renderFromTexture->mInv).m[1];
    local_158.field_2._8_8_ = *(undefined8 *)((renderFromTexture->mInv).m[1] + 2);
    uStack_138 = *(undefined8 *)(renderFromTexture->mInv).m[2];
    uStack_130 = *(undefined8 *)((renderFromTexture->mInv).m[2] + 2);
    uStack_128 = *(undefined8 *)(renderFromTexture->mInv).m[3];
    uStack_120 = *(undefined8 *)((renderFromTexture->mInv).m[3] + 2);
    local_118 = *(undefined8 *)(renderFromTexture->m).m[0];
    uStack_110 = *(undefined8 *)((renderFromTexture->m).m[0] + 2);
    uStack_108 = *(undefined8 *)(renderFromTexture->m).m[1];
    uStack_100 = *(undefined8 *)((renderFromTexture->m).m[1] + 2);
    uStack_f8 = *(undefined8 *)(renderFromTexture->m).m[2];
    uStack_f0 = *(undefined8 *)((renderFromTexture->m).m[2] + 2);
    uStack_e8 = *(undefined8 *)(renderFromTexture->m).m[3];
    uStack_e0 = *(undefined8 *)((renderFromTexture->m).m[3] + 2);
    iVar4 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x80,4);
    puVar7 = (undefined8 *)CONCAT44(extraout_var_01,iVar4);
    puVar7[8] = local_118;
    puVar7[9] = uStack_110;
    puVar7[10] = uStack_108;
    puVar7[0xb] = uStack_100;
    puVar7[0xc] = uStack_f8;
    puVar7[0xd] = uStack_f0;
    puVar7[0xe] = uStack_e8;
    puVar7[0xf] = uStack_e0;
    *puVar7 = local_158._M_dataplus._M_p;
    puVar7[1] = local_158._M_string_length;
    puVar7[2] = local_158.field_2._M_allocated_capacity;
    puVar7[3] = local_158.field_2._8_8_;
    puVar7[4] = uStack_138;
    puVar7[5] = uStack_130;
    puVar7[6] = uStack_128;
    puVar7[7] = uStack_120;
    uVar6 = (ulong)puVar7 | 0x2000000000000;
  }
  (this->
  super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  ).bits = uVar6;
LAB_002aa99f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  return (TextureMapping2DHandle)
         (TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
          )this;
}

Assistant:

TextureMapping2DHandle TextureMapping2DHandle::Create(
    const ParameterDictionary &parameters, const Transform &renderFromTexture,
    const FileLoc *loc, Allocator alloc) {
    std::string type = parameters.GetOneString("mapping", "uv");
    if (type == "uv") {
        Float su = parameters.GetOneFloat("uscale", 1.);
        Float sv = parameters.GetOneFloat("vscale", 1.);
        Float du = parameters.GetOneFloat("udelta", 0.);
        Float dv = parameters.GetOneFloat("vdelta", 0.);
        return alloc.new_object<UVMapping2D>(su, sv, du, dv);
    } else if (type == "spherical")
        return alloc.new_object<SphericalMapping2D>(Inverse(renderFromTexture));
    else if (type == "cylindrical")
        return alloc.new_object<CylindricalMapping2D>(Inverse(renderFromTexture));
    else if (type == "planar")
        return alloc.new_object<PlanarMapping2D>(
            parameters.GetOneVector3f("v1", Vector3f(1, 0, 0)),
            parameters.GetOneVector3f("v2", Vector3f(0, 1, 0)),
            parameters.GetOneFloat("udelta", 0.f), parameters.GetOneFloat("vdelta", 0.f));
    else {
        Error(loc, "2D texture mapping \"%s\" unknown", type);
        return alloc.new_object<UVMapping2D>();
    }
}